

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O0

void log_message_chunk(MESSAGE_SENDER_INSTANCE *message_sender,char *name,AMQP_VALUE value)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG local_58;
  char *local_48;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  char *value_as_string;
  AMQP_VALUE value_local;
  char *name_local;
  MESSAGE_SENDER_INSTANCE *message_sender_local;
  
  p_Var1 = xlogging_get_log_function();
  if ((p_Var1 != (LOGGER_LOG)0x0) && ((message_sender->field_0x30 & 1) == 1)) {
    l = (LOGGER_LOG)0x0;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      local_48 = name;
      if (name == (char *)0x0) {
        local_48 = "NULL";
      }
      (*p_Var1)(AZ_LOG_TRACE,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                ,"log_message_chunk",0xbd,0,"%s",local_48);
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      l = (LOGGER_LOG)amqpvalue_to_string(value);
      local_58 = l;
      if (l == (LOGGER_LOG)0x0) {
        local_58 = (LOGGER_LOG)0x1ba2a9;
      }
      (*p_Var1)(AZ_LOG_TRACE,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                ,"log_message_chunk",0xbe,0,"%s",local_58);
    }
    if (l != (LOGGER_LOG)0x0) {
      free(l);
    }
  }
  return;
}

Assistant:

static void log_message_chunk(MESSAGE_SENDER_INSTANCE* message_sender, const char* name, AMQP_VALUE value)
{
#ifdef NO_LOGGING
    (void)message_sender;
    (void)name;
    (void)value;
#else
    if (xlogging_get_log_function() != NULL && message_sender->is_trace_on == 1)
    {
        char* value_as_string = NULL;
        LOG(AZ_LOG_TRACE, 0, "%s", MU_P_OR_NULL(name));
        LOG(AZ_LOG_TRACE, 0, "%s", ((value_as_string = amqpvalue_to_string(value)), MU_P_OR_NULL(value_as_string)));
        if (value_as_string != NULL)
        {
            free(value_as_string);
        }
    }
#endif
}